

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::processAttributeDeclRef
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,XMLCh *refName,
          XMLCh *useAttr,XMLCh *defaultVal,XMLCh *fixedVal)

{
  XMLBuffer *this_00;
  ulong uVar1;
  SchemaInfo **enclosingSchema;
  short *psVar2;
  XMLCh XVar3;
  uint saveScope;
  DefAttTypes defType;
  XMLStringPool *pXVar4;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar5;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *pRVar6;
  DatatypeValidator *pDVar7;
  XercesAttGroupInfo *pXVar8;
  QName *pQVar9;
  byte bVar10;
  ListType aListType;
  long lVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SchemaAttDef *pSVar15;
  Grammar *pGVar16;
  SchemaInfo *toRestore_00;
  ulong uVar17;
  DOMElement *elem_00;
  SchemaAttDef *this_01;
  XMLCh *pXVar18;
  XMLSize_t count;
  XMLCh *pXVar19;
  XMLCh XVar20;
  ulong uVar21;
  XMLCh *pXVar22;
  XMLCh *pXVar23;
  RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *pRVar24;
  bool bVar25;
  XMLCh *local_78;
  
  if (this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0 && typeInfo == (ComplexTypeInfo *)0x0)
  {
    return;
  }
  iVar13 = XMLString::indexOf(refName,L':');
  if (iVar13 + 1U < 2) {
    pXVar23 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,refName,(long)iVar13);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar14 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar13 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar14);
    pXVar23 = (XMLCh *)CONCAT44(extraout_var,iVar13);
  }
  iVar13 = XMLString::indexOf(refName,L':');
  count = 0;
  if (refName != (XMLCh *)0x0) {
    do {
      psVar2 = (short *)((long)refName + count);
      count = count + 2;
    } while (*psVar2 != 0);
    count = ((long)count >> 1) - 1;
  }
  if (count == (long)(iVar13 + 1)) {
    pXVar22 = L"";
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar13 == -1) {
      this_00->fIndex = 0;
      pXVar22 = refName;
    }
    else {
      count = count + ~(long)iVar13;
      this_00->fIndex = 0;
      pXVar22 = refName + (long)iVar13 + 1;
    }
    XMLBuffer::append(this_00,pXVar22,count);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar14 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar13 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar14);
    pXVar22 = (XMLCh *)CONCAT44(extraout_var_00,iVar13);
  }
  pXVar23 = resolvePrefixToURI(this,elem,pXVar23);
  uVar14 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                     (this->fURIStringPool,pXVar23);
  if (((typeInfo != (ComplexTypeInfo *)0x0) &&
      (pSVar15 = RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::get
                           (typeInfo->fAttDefs,pXVar22,uVar14), pSVar15 != (SchemaAttDef *)0x0)) ||
     ((this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0 &&
      (bVar12 = XercesAttGroupInfo::containsAttribute(this->fCurrentAttGroupInfo,pXVar22,uVar14),
      bVar12)))) {
    pXVar19 = L"http://apache.org/xml/messages/XMLErrors";
    iVar13 = 0x46;
    goto LAB_0032ce80;
  }
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  pXVar19 = this->fTargetNSURIString;
  aListType = INCLUDE;
  if (pXVar23 == pXVar19) {
LAB_0032cc3e:
    pRVar6 = this->fAttributeDeclRegistry;
    if ((pXVar22 == (XMLCh *)0x0) || (uVar17 = (ulong)(ushort)*pXVar22, uVar17 == 0)) {
      uVar17 = 0;
    }
    else {
      XVar20 = pXVar22[1];
      if (XVar20 != L'\0') {
        pXVar23 = pXVar22 + 2;
        do {
          uVar17 = (ulong)(ushort)XVar20 + (uVar17 >> 0x18) + uVar17 * 0x26;
          XVar20 = *pXVar23;
          pXVar23 = pXVar23 + 1;
        } while (XVar20 != L'\0');
      }
      uVar17 = uVar17 % pRVar6->fHashModulus;
    }
    pRVar24 = pRVar6->fBucketList[uVar17];
    if (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0) {
      do {
        bVar12 = StringHasher::equals((StringHasher *)&pRVar6->field_0x30,pXVar22,pRVar24->fKey);
        if (bVar12) goto LAB_0032ccf6;
        pRVar24 = pRVar24->fNext;
      } while (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0);
    }
    elem_00 = SchemaInfo::getTopLevelComponent
                        (*enclosingSchema,3,L"attribute",pXVar22,enclosingSchema);
    if (elem_00 != (DOMElement *)0x0) {
      traverseAttributeDecl(this,elem_00,(ComplexTypeInfo *)0x0,true);
    }
LAB_0032ccf6:
    pRVar6 = this->fAttributeDeclRegistry;
    if ((pXVar22 == (XMLCh *)0x0) || (uVar17 = (ulong)(ushort)*pXVar22, uVar17 == 0)) {
      uVar17 = 0;
    }
    else {
      XVar20 = pXVar22[1];
      if (XVar20 != L'\0') {
        pXVar23 = pXVar22 + 2;
        do {
          uVar17 = (ulong)(ushort)XVar20 + (uVar17 >> 0x18) + uVar17 * 0x26;
          XVar20 = *pXVar23;
          pXVar23 = pXVar23 + 1;
        } while (XVar20 != L'\0');
      }
      uVar17 = uVar17 % pRVar6->fHashModulus;
    }
    pRVar24 = pRVar6->fBucketList[uVar17];
    if (pRVar24 == (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0) {
      pSVar15 = (SchemaAttDef *)0x0;
    }
    else {
      do {
        bVar12 = StringHasher::equals((StringHasher *)&pRVar6->field_0x30,pXVar22,pRVar24->fKey);
        if (bVar12) {
          pSVar15 = (SchemaAttDef *)pRVar24->fData;
          goto LAB_0032cd92;
        }
        pRVar24 = pRVar24->fNext;
      } while (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0);
      pSVar15 = (SchemaAttDef *)0x0;
    }
LAB_0032cd92:
    if (*enclosingSchema != toRestore) {
      restoreSchemaInfo(this,toRestore,aListType,saveScope);
    }
    if (pSVar15 == (SchemaAttDef *)0x0) {
LAB_0032ce75:
      iVar13 = 0x29;
      goto LAB_0032ce7a;
    }
    defType = (pSVar15->super_XMLAttDef).fDefaultType;
    pXVar23 = (pSVar15->super_XMLAttDef).fValue;
    bVar10 = 1;
    if ((defType == Fixed) &&
       ((defaultVal != (XMLCh *)0x0 ||
        ((bVar10 = 1, fixedVal != (XMLCh *)0x0 &&
         (bVar12 = XMLString::equals(fixedVal,pXVar23), !bVar12)))))) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x87,refName,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      bVar10 = 0;
    }
    pDVar7 = pSVar15->fDatatypeValidator;
    if ((pDVar7 == (DatatypeValidator *)0x0) || (pDVar7->fType != ID)) {
LAB_0032cee9:
      if (useAttr == L"required") {
        bVar12 = true;
LAB_0032cf67:
        pXVar22 = L"prohibited";
        do {
          XVar20 = *useAttr;
          if (XVar20 == L'\0') goto LAB_0032cf4d;
          useAttr = useAttr + 1;
          XVar3 = *pXVar22;
          pXVar22 = pXVar22 + 1;
        } while (XVar20 == XVar3);
        bVar25 = false;
      }
      else {
        pXVar22 = L"required";
        pXVar19 = useAttr;
        if (useAttr == (XMLCh *)0x0) {
LAB_0032cf2d:
          bVar12 = *pXVar22 == L'\0';
        }
        else {
          do {
            XVar20 = *pXVar19;
            if (XVar20 == L'\0') goto LAB_0032cf2d;
            XVar3 = *pXVar22;
            pXVar22 = pXVar22 + 1;
            pXVar19 = pXVar19 + 1;
          } while (XVar20 == XVar3);
          bVar12 = false;
        }
        if (useAttr == L"prohibited") {
          bVar25 = true;
        }
        else {
          if (useAttr != (XMLCh *)0x0) goto LAB_0032cf67;
          pXVar22 = L"prohibited";
LAB_0032cf4d:
          bVar25 = *pXVar22 == L'\0';
        }
      }
      pQVar9 = pSVar15->fAttName;
      this_01 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
      SchemaAttDef::SchemaAttDef
                (this_01,pQVar9->fPrefix,pQVar9->fLocalPart,pQVar9->fURIId,pXVar23,
                 (pSVar15->super_XMLAttDef).fType,defType,(XMLCh *)0x0,
                 this->fGrammarPoolMemoryManager);
      this_01->fBaseAttDecl = pSVar15;
      this_01->fPSVIScope = SCP_GLOBAL;
      if (defType == Fixed) {
        if ((bool)(bVar10 & bVar12)) {
          (this_01->super_XMLAttDef).fDefaultType = Required_And_Fixed;
        }
        goto LAB_0032d0ee;
      }
      if (bVar25) {
        (this_01->super_XMLAttDef).fDefaultType = DefAttTypes_Max;
        goto LAB_0032d0ee;
      }
      local_78 = defaultVal;
      if (bVar12) {
        if (fixedVal == (XMLCh *)0x0) {
          (this_01->super_XMLAttDef).fDefaultType = Required;
          if (defaultVal == (XMLCh *)0x0) goto LAB_0032d0ee;
        }
        else {
          (this_01->super_XMLAttDef).fDefaultType = Required_And_Fixed;
LAB_0032d085:
          local_78 = fixedVal;
        }
      }
      else {
        if (fixedVal != (XMLCh *)0x0) {
          (this_01->super_XMLAttDef).fDefaultType = Fixed;
          goto LAB_0032d085;
        }
        if (defaultVal == (XMLCh *)0x0) goto LAB_0032d0ee;
        (this_01->super_XMLAttDef).fDefaultType = DefAttTypes_Min;
      }
      if (pDVar7 != (DatatypeValidator *)0x0) {
        if (pDVar7->fType == ID) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x88,refName,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        else {
          (*(pDVar7->super_XSerializable)._vptr_XSerializable[8])
                    (pDVar7,local_78,this->fSchemaInfo->fValidationContext,this->fMemoryManager);
        }
      }
      XMLAttDef::setValue((XMLAttDef *)this_01,local_78);
LAB_0032d0ee:
      this_01->fDatatypeValidator = pDVar7;
      if (typeInfo != (ComplexTypeInfo *)0x0) {
        ComplexTypeInfo::addAttDef(typeInfo,this_01);
      }
      if (this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0) {
        return;
      }
      XercesAttGroupInfo::addAttDef
                (this->fCurrentAttGroupInfo,this_01,typeInfo != (ComplexTypeInfo *)0x0);
      return;
    }
    pXVar8 = this->fCurrentAttGroupInfo;
    if (pXVar8 == (XercesAttGroupInfo *)0x0) {
      if (typeInfo->fAttWithTypeId != true) {
        typeInfo->fAttWithTypeId = true;
        goto LAB_0032cee9;
      }
      iVar13 = 0x89;
    }
    else {
      if (pXVar8->fTypeWithId != true) {
        pXVar8->fTypeWithId = true;
        goto LAB_0032cee9;
      }
      iVar13 = 0x8a;
    }
LAB_0032ce7a:
    pXVar19 = L"http://apache.org/xml/messages/XMLErrors";
    pXVar23 = refName;
  }
  else {
    pXVar18 = pXVar23;
    if (pXVar19 == (XMLCh *)0x0 || pXVar23 == (XMLCh *)0x0) {
      if (pXVar23 == (XMLCh *)0x0) {
        if (pXVar19 == (XMLCh *)0x0) goto LAB_0032cc3e;
LAB_0032cb0e:
        XVar20 = *pXVar19;
      }
      else {
        XVar20 = *pXVar23;
        if ((pXVar19 != (XMLCh *)0x0) && (XVar20 == L'\0')) goto LAB_0032cb0e;
      }
      if (XVar20 == L'\0') goto LAB_0032cc3e;
    }
    else {
      do {
        XVar20 = *pXVar18;
        if (XVar20 == L'\0') goto LAB_0032cb0e;
        XVar3 = *pXVar19;
        pXVar19 = pXVar19 + 1;
        pXVar18 = pXVar18 + 1;
      } while (XVar20 == XVar3);
    }
    iVar13 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                       (this->fURIStringPool,pXVar23);
    pVVar5 = this->fImportedNSList;
    if ((pVVar5 == (ValueVectorOf<int> *)0x0) || (uVar17 = pVVar5->fCurCount, uVar17 == 0)) {
LAB_0032cbab:
      pXVar19 = L"http://apache.org/xml/messages/XMLErrors";
      iVar13 = 0x8e;
    }
    else {
      if (*pVVar5->fElemList != iVar13) {
        uVar21 = 0;
        do {
          if (uVar17 - 1 == uVar21) goto LAB_0032cbab;
          uVar1 = uVar21 + 1;
          lVar11 = uVar21 + 1;
          uVar21 = uVar1;
        } while (pVVar5->fElemList[lVar11] != iVar13);
        if (uVar17 <= uVar1) goto LAB_0032cbab;
      }
      pGVar16 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar23);
      if ((pGVar16 != (Grammar *)0x0) &&
         (iVar13 = (*(pGVar16->super_XSerializable)._vptr_XSerializable[5])(pGVar16), iVar13 == 1))
      {
        pSVar15 = (SchemaAttDef *)
                  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::get
                            ((RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)
                             pGVar16[6].super_XSerializable._vptr_XSerializable,pXVar22);
        if (pSVar15 != (SchemaAttDef *)0x0) {
          aListType = INCLUDE;
          goto LAB_0032cd92;
        }
        toRestore_00 = SchemaInfo::getImportInfo(*enclosingSchema,uVar14);
        if ((toRestore_00 != (SchemaInfo *)0x0) && (toRestore_00->fProcessed != true)) {
          aListType = IMPORT;
          restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
          goto LAB_0032cc3e;
        }
        goto LAB_0032ce75;
      }
      pXVar19 = L"http://apache.org/xml/messages/XMLValidity";
      iVar13 = 0x26;
    }
  }
  pXVar22 = (XMLCh *)0x0;
LAB_0032ce80:
  reportSchemaError(this,elem,pXVar19,iVar13,pXVar23,pXVar22,(XMLCh *)0x0,(XMLCh *)0x0);
  return;
}

Assistant:

void TraverseSchema::processAttributeDeclRef(const DOMElement* const elem,
                                             ComplexTypeInfo* const typeInfo,
                                             const XMLCh* const refName,
                                             const XMLCh* const useAttr,
                                             const XMLCh* const defaultVal,
                                             const XMLCh* const fixedVal) {

    if (!typeInfo && !fCurrentAttGroupInfo) {
        return;
    }

    const XMLCh* prefix = getPrefix(refName);
    const XMLCh* localPart = getLocalPart(refName);
    const XMLCh* uriStr = resolvePrefixToURI(elem, prefix);
    unsigned int attURI = fURIStringPool->addOrFind(uriStr);

    // Check for duplicate references
    if (typeInfo && typeInfo->getAttDef(localPart, attURI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateRefAttribute, uriStr, localPart);
        return;
    }
    else if (fCurrentAttGroupInfo && fCurrentAttGroupInfo->containsAttribute(localPart, attURI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateRefAttribute, uriStr, localPart);
        return;
    }

    // check for different namespace
    SchemaInfo* saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    SchemaAttDef* refAttDef = 0;
    unsigned int saveScope = fCurrentScope;

    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

        if (grammar == 0 || grammar->getGrammarType() != Grammar::SchemaGrammarType) {

            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
            return;
        }

        refAttDef = (SchemaAttDef*) ((SchemaGrammar*) grammar)->getAttributeDeclRegistry()->get(localPart);

        if (!refAttDef) {

            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(attURI);

            if (!impInfo || impInfo->getProcessed()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelAttributeNotFound, refName);
                return;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }

    // if Global attribute registry does not contain the ref attribute, get
    // the referred attribute declaration and traverse it.
    if (!refAttDef) {

        if (fAttributeDeclRegistry->containsKey(localPart) == false) {

            DOMElement* referredAttribute = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Attribute,
                SchemaSymbols::fgELT_ATTRIBUTE, localPart, &fSchemaInfo);

            if (referredAttribute != 0) {
                traverseAttributeDecl(referredAttribute, 0, true);
            }
        }

        refAttDef = (SchemaAttDef*) fAttributeDeclRegistry->get(localPart);
    }

    // restore schema information, if necessary
    if (fSchemaInfo != saveInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    if (!refAttDef) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelAttributeNotFound, refName);
        return;
    }

    XMLAttDef::DefAttTypes refAttDefType = refAttDef->getDefaultType();
    const XMLCh* refAttValue = refAttDef->getValue();
    bool invalidAttUse = false;

    if (refAttDefType == XMLAttDef::Fixed &&
        (defaultVal || (fixedVal && !XMLString::equals(fixedVal, refAttValue)))) {

        invalidAttUse = true;
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttUseCorrect, refName);
    }

    DatatypeValidator* attDV = refAttDef->getDatatypeValidator();

    //check for multiple attributes with type derived from ID
    if (attDV && attDV->getType() == DatatypeValidator::ID) {

        if (fCurrentAttGroupInfo) {

            if (fCurrentAttGroupInfo->containsTypeWithId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, refName);
                return;
            }

            fCurrentAttGroupInfo->setTypeWithId(true);
        }
        else {

            if (typeInfo->containsAttWithTypeId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, refName);
                return;
            }

            typeInfo->setAttWithTypeId(true);
        }
    }

    bool required = XMLString::equals(useAttr,SchemaSymbols::fgATTVAL_REQUIRED);
    bool prohibited = XMLString::equals(useAttr,SchemaSymbols::fgATTVAL_PROHIBITED);
    QName* attQName = refAttDef->getAttName();
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attQName->getPrefix(),
                                            attQName->getLocalPart(),
                                            attQName->getURI(),
                                            refAttValue,
                                            refAttDef->getType(),
                                            refAttDefType,
                                            0, fGrammarPoolMemoryManager);

    attDef->setBaseAttDecl(refAttDef);
    attDef->setPSVIScope(PSVIDefs::SCP_GLOBAL);

    if (refAttDefType == XMLAttDef::Fixed) {
        if (required && !invalidAttUse) {
            attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
        }
    }
    else {

        if (prohibited) {
            attDef->setDefaultType(XMLAttDef::Prohibited);
        }
        else {

            const XMLCh* valueConstraint = defaultVal;

            if (required){

                if (fixedVal) {

                    attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
                    valueConstraint = fixedVal;
                }
                else {
                    attDef->setDefaultType(XMLAttDef::Required);
                }
            }
            else
            {
                if (fixedVal) {
                    attDef->setDefaultType(XMLAttDef::Fixed);
                    valueConstraint = fixedVal;
                }
                else if (defaultVal) {
                    attDef->setDefaultType(XMLAttDef::Default);
                }
            }

            if (valueConstraint) {

                // validate content of value constraint
                if (attDV) {

                    if (attDV->getType() == DatatypeValidator::ID) {
                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect3, refName);
                    }
                    else {
                        try {
                            attDV->validate(valueConstraint
                                          , fSchemaInfo->getValidationContext()
                                          , fMemoryManager);
                        }
                        catch(const XMLException& excep) {
                            reportSchemaError(elem, excep);
                        }
                        catch(const OutOfMemoryException&)
                        {
                            throw;
                        }
                        catch (...) {
                            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valueConstraint);
                        }
                    }
                }

                attDef->setValue(valueConstraint);
            }
        }
    }

    attDef->setDatatypeValidator(attDV);

    bool toClone = false;

    if (typeInfo) {

        toClone = true;
        typeInfo->addAttDef(attDef);
    }

    if (fCurrentAttGroupInfo) {
        fCurrentAttGroupInfo->addAttDef(attDef, toClone);
    }
}